

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

bool efsw::FileInfo::isLink(string *filePath)

{
  FileInfo fi;
  FileInfo local_58;
  
  FileInfo(&local_58,filePath,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Filepath._M_dataplus._M_p != &local_58.Filepath.field_2) {
    operator_delete(local_58.Filepath._M_dataplus._M_p);
  }
  return (local_58.Permissions & 0xf000) == 0xa000;
}

Assistant:

bool FileInfo::isLink( const std::string& filePath ) {
	FileInfo fi( filePath, true );
	return fi.isLink();
}